

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O1

void P_PoisonDamage(player_t *player,AActor *source,int damage,bool playPainSound)

{
  APlayerPawn *this;
  AInventory *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FState *newstate;
  int iVar5;
  double dVar6;
  FName local_30;
  FName local_2c;
  FName local_28;
  int local_24;
  
  if (player == (player_t *)0x0) {
    return;
  }
  this = player->mo;
  if ((this->super_AActor).health < 1) {
    return;
  }
  if (damage < 1000000) {
    if (((this->super_AActor).flags2.Value & 0x8000000) != 0) {
      return;
    }
    if ((player->cheats & 2) != 0) {
      return;
    }
  }
  if ((player->cheats & 0x2000000) != 0) {
    return;
  }
  dVar6 = G_SkillProperty(SKILLP_DamageFactor);
  pAVar1 = (this->super_AActor).Inventory.field_0.p;
  if (pAVar1 != (AInventory *)0x0) {
    if (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
      local_24 = (player->poisontype).Index;
      (*(((this->super_AActor).Inventory.field_0.p)->super_AActor).super_DThinker.super_DObject.
        _vptr_DObject[0x3c])();
    }
    else {
      (this->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
    }
  }
  local_28.Index = (player->poisontype).Index;
  iVar2 = AActor::ApplyDamageFactor(&this->super_AActor,&local_28,(int)(dVar6 * (double)damage));
  if (iVar2 < 1) {
    return;
  }
  if (((player->health <= iVar2) &&
      (iVar3 = G_SkillProperty(SKILLP_AutoUseHealth), iVar3 != 0 || deathmatch.Value != 0)) &&
     (player->morphTics == 0)) {
    P_AutoUseHealth(player,(iVar2 - player->health) + 1);
  }
  iVar3 = player->health - iVar2;
  player->health = iVar3;
  if ((iVar3 < 0x32) && (deathmatch.Value == 0)) {
    P_AutoUseStrifeHealth(player);
  }
  if (player->health < 0) {
    player->health = 0;
  }
  (player->attacker).field_0.p = source;
  iVar3 = (this->super_AActor).health;
  iVar5 = iVar3 - iVar2;
  (this->super_AActor).health = iVar5;
  if (iVar5 != 0 && iVar2 <= iVar3) goto LAB_00502be5;
  if (((uint)player->cheats >> 0x1b & 1) == 0) {
    if ((999999 < iVar2) || (((player->mo->super_AActor).flags7.Value & 0x40) == 0)) {
LAB_00502b7c:
      if (((uint)player->cheats >> 0x18 & 1) == 0) {
        (this->super_AActor).special1 = iVar2;
        if (player->morphTics == 0) {
          iVar3 = (player->poisontype).Index;
          if ((iVar3 != 0x9f) || (iVar4 = 0x9f, iVar2 < 0x1a || iVar5 < -0x31)) {
            iVar4 = iVar3;
          }
          (this->super_AActor).DamageType.super_FName.Index = iVar4;
        }
        (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0xf])
                  (this,source,source,0);
        return;
      }
    }
  }
  else if (999999 < iVar2) goto LAB_00502b7c;
  (this->super_AActor).health = 1;
  player->health = 1;
LAB_00502be5:
  if (playPainSound && ((byte)level.time & 0x3f) == 0) {
    local_2c.Index = 0x83;
    local_30.Index = (player->poisonpaintype).Index;
    newstate = AActor::FindState(&this->super_AActor,&local_2c,&local_30,false);
    if (newstate != (FState *)0x0) {
      AActor::SetState(&this->super_AActor,newstate,false);
    }
  }
  return;
}

Assistant:

void P_PoisonDamage (player_t *player, AActor *source, int damage,
	bool playPainSound)
{
	AActor *target;

	if (player == NULL)
	{
		return;
	}
	target = player->mo;
	if (target->health <= 0)
	{
		return;
	}
	if ((damage < TELEFRAG_DAMAGE && ((target->flags2 & MF2_INVULNERABLE) ||
		(player->cheats & CF_GODMODE))) || (player->cheats & CF_GODMODE2))
	{ // target is invulnerable
		return;
	}
	// Take half damage in trainer mode
	damage = int(damage * G_SkillProperty(SKILLP_DamageFactor));
	// Handle passive damage modifiers (e.g. PowerProtection)
	if (target->Inventory != NULL)
	{
		target->Inventory->ModifyDamage(damage, player->poisontype, damage, true);
	}
	// Modify with damage factors
	damage = target->ApplyDamageFactor(player->poisontype, damage);

	if (damage <= 0)
	{ // Damage was reduced to 0, so don't bother further.
		return;
	}
	if (damage >= player->health
		&& (G_SkillProperty(SKILLP_AutoUseHealth) || deathmatch)
		&& !player->morphTics)
	{ // Try to use some inventory health
		P_AutoUseHealth(player, damage - player->health+1);
	}
	player->health -= damage; // mirror mobj health here for Dave
	if (player->health < 50 && !deathmatch)
	{
		P_AutoUseStrifeHealth(player);
	}
	if (player->health < 0)
	{
		player->health = 0;
	}
	player->attacker = source;

	//
	// do the damage
	//
	target->health -= damage;
	if (target->health <= 0)
	{ // Death
		if ((((player->cheats & CF_BUDDHA) || (player->mo->flags7 & MF7_BUDDHA)) && damage < TELEFRAG_DAMAGE) || (player->cheats & CF_BUDDHA2))
		{ // [SP] Save the player... 
			player->health = target->health = 1;
		}
		else
		{
			target->special1 = damage;
			if (player && !player->morphTics)
			{ // Check for flame death
				if ((player->poisontype == NAME_Fire) && (target->health > -50) && (damage > 25))
				{
					target->DamageType = NAME_Fire;
				}
				else
				{
					target->DamageType = player->poisontype;
				}
			}
			target->Die(source, source);
			return;
		}
	}
	if (!(level.time&63) && playPainSound)
	{
		FState *painstate = target->FindState(NAME_Pain, player->poisonpaintype);
		if (painstate != NULL)
		{
			target->SetState(painstate);
		}
	}
/*
	if((P_Random() < target->info->painchance)
		&& !(target->flags&MF_SKULLFLY))
	{
		target->flags |= MF_JUSTHIT; // fight back!
		P_SetMobjState(target, target->info->painstate);
	}
*/
}